

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::InstallSegueBase(CWriter *this,Memory *memory,bool save_old_value)

{
  int iVar1;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *extraout_RDX_01;
  Newline *extraout_RDX_02;
  Newline *pNVar2;
  Newline *u;
  Newline *u_00;
  Newline *u_01;
  char *pcVar3;
  ExternalInstanceRef primary_memory;
  CWriter *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  CWriter *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  CWriter *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  ExternalInstanceRef local_38;
  
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
             ::_M_manager;
  iVar1 = this->indent_;
  this->indent_ = 0;
  local_58._M_unused._M_object = this;
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
  ::_M_invoke(&local_58);
  this->indent_ = iVar1;
  pNVar2 = extraout_RDX;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
    pNVar2 = extraout_RDX_00;
  }
  if (save_old_value) {
    uStack_70 = 0;
    pcStack_60 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2545:17)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2545:17)>
               ::_M_manager;
    iVar1 = this->indent_;
    this->indent_ = 0;
    local_78 = this;
    (anonymous_namespace)::CWriter::Write<char_const(&)[32],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [32])"#if !WASM_RT_SEGUE_FREE_SEGMENT",pNVar2);
    this->indent_ = iVar1;
    pNVar2 = extraout_RDX_01;
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
      pNVar2 = extraout_RDX_02;
    }
    pcVar3 = "void* segue_saved_base = wasm_rt_segue_read_base();";
    (anonymous_namespace)::CWriter::Write<char_const(&)[52],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [52])"void* segue_saved_base = wasm_rt_segue_read_base();",
               pNVar2);
    uStack_90 = 0;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2547:17)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2547:17)>
               ::_M_manager;
    iVar1 = this->indent_;
    this->indent_ = 0;
    local_98 = this;
    (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [7])pcVar3,u);
    this->indent_ = iVar1;
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
  }
  local_38.super_GlobalName.type = Memory;
  local_38.super_GlobalName.name = &memory->name;
  WriteData(this,"wasm_rt_segue_write_base(",0x19);
  Write(this,&local_38);
  pcVar3 = ".data);";
  (anonymous_namespace)::CWriter::Write<char_const(&)[8],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [8])".data);",u_00);
  uStack_b0 = 0;
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2552:15)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2552:15)>
             ::_M_manager;
  iVar1 = this->indent_;
  this->indent_ = 0;
  local_b8 = this;
  (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [7])pcVar3,u_01);
  this->indent_ = iVar1;
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  return;
}

Assistant:

void CWriter::InstallSegueBase(Memory* memory, bool save_old_value) {
  NonIndented(
      [&] { Write("#if WASM_RT_USE_SEGUE_FOR_THIS_MODULE", Newline()); });
  if (save_old_value) {
    NonIndented([&] { Write("#if !WASM_RT_SEGUE_FREE_SEGMENT", Newline()); });
    Write("void* segue_saved_base = wasm_rt_segue_read_base();", Newline());
    NonIndented([&] { Write("#endif", Newline()); });
  }
  auto primary_memory =
      ExternalInstanceRef(ModuleFieldType::Memory, memory->name);
  Write("wasm_rt_segue_write_base(", primary_memory, ".data);", Newline());
  NonIndented([&] { Write("#endif", Newline()); });
}